

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::MaskProportionalityCase::init
          (MaskProportionalityCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  GLenum GVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  undefined1 local_198 [384];
  
  pTVar1 = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  local_198._0_8_ = pTVar1;
  if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
    glwEnable(0x809e);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x45c);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
    std::operator<<((ostream *)(local_198 + 8),"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    glwEnable(0x80a0);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_SAMPLE_COVERAGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x463);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
    std::operator<<((ostream *)(local_198 + 8),"GL_SAMPLE_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
  iVar3 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx,(this->super_MultisampleCase).m_numSamples * 5)
  ;
  iVar4 = 2;
  if (2 < iVar3) {
    iVar4 = iVar3;
  }
  this->m_numIterations = iVar4;
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  return extraout_EAX;
}

Assistant:

void MaskProportionalityCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	MultisampleCase::init();

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
	}
	else
	{
		DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

		GLU_CHECK_CALL(glEnable(GL_SAMPLE_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	m_numIterations = de::max(2, getIterationCount(m_testCtx, m_numSamples * 5));

	randomizeViewport(); // \note Using the same viewport for every iteration since coverage mask may depend on window-relative pixel coordinate.
}